

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ClockingBlockSymbol::serializeTo(ClockingBlockSymbol *this,ASTSerializer *serializer)

{
  TimingControl *__n;
  string_view name;
  string_view name_00;
  ClockingSkew CVar1;
  ClockingSkew skew;
  
  __n = getEvent(this);
  ASTSerializer::write(serializer,5,"event",(size_t)__n);
  CVar1 = getDefaultInputSkew(this);
  skew.delay = CVar1.delay;
  skew.edge = CVar1.edge;
  if (skew.edge != None || skew.delay != (TimingControl *)0x0) {
    name._M_str = "defaultInputSkew";
    name._M_len = 0x10;
    ASTSerializer::writeProperty(serializer,name);
    ASTSerializer::startObject(serializer);
    ClockingSkew::serializeTo(&skew,serializer);
    ASTSerializer::endObject(serializer);
  }
  CVar1 = getDefaultOutputSkew(this);
  skew.delay = CVar1.delay;
  skew.edge = CVar1.edge;
  if (skew.edge != None || skew.delay != (TimingControl *)0x0) {
    name_00._M_str = "defaultOutputSkew";
    name_00._M_len = 0x11;
    ASTSerializer::writeProperty(serializer,name_00);
    ASTSerializer::startObject(serializer);
    ClockingSkew::serializeTo(&skew,serializer);
    ASTSerializer::endObject(serializer);
  }
  return;
}

Assistant:

void ClockingBlockSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("event", getEvent());

    if (auto skew = getDefaultInputSkew(); skew.hasValue()) {
        serializer.writeProperty("defaultInputSkew");
        serializer.startObject();
        skew.serializeTo(serializer);
        serializer.endObject();
    }

    if (auto skew = getDefaultOutputSkew(); skew.hasValue()) {
        serializer.writeProperty("defaultOutputSkew");
        serializer.startObject();
        skew.serializeTo(serializer);
        serializer.endObject();
    }
}